

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_noise_strength_solver_solve(aom_noise_strength_solver_t *solver)

{
  uint uVar1;
  double *__src;
  ulong uVar2;
  double *__dest;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int i;
  int iVar6;
  double *pdVar7;
  double *pdVar8;
  size_t size;
  long lVar9;
  long lVar10;
  double dVar11;
  
  uVar1 = solver->num_bins;
  lVar10 = (long)(int)uVar1;
  iVar6 = solver->num_equations;
  __src = (solver->eqns).A;
  size = lVar10 * lVar10 * 8;
  __dest = (double *)aom_malloc(size);
  if (__dest == (double *)0x0) {
    fwrite("Unable to allocate copy of A\n",0x1d,1,_stderr);
    iVar6 = 0;
  }
  else {
    dVar11 = ((double)iVar6 + (double)iVar6) / (double)(int)uVar1;
    memcpy(__dest,__src,size);
    uVar5 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    iVar6 = 1;
    pdVar7 = __dest;
    pdVar8 = __dest;
    while( true ) {
      lVar9 = (long)iVar6;
      if ((long)(int)(uVar1 - 1) <= (long)iVar6) {
        lVar9 = (long)(int)(uVar1 - 1);
      }
      uVar2 = 1;
      if (1 < (int)uVar5) {
        uVar2 = uVar5;
      }
      if (uVar3 == uVar5) break;
      uVar5 = uVar5 + 1;
      pdVar7[(uVar2 & 0xffffffff) - 1] = pdVar7[(uVar2 & 0xffffffff) - 1] - dVar11;
      *pdVar8 = *pdVar8 + dVar11 + dVar11;
      pdVar7[lVar9] = pdVar7[lVar9] - dVar11;
      pdVar8 = pdVar8 + lVar10 + 1;
      pdVar7 = pdVar7 + lVar10;
      iVar6 = iVar6 + 1;
    }
    iVar6 = solver->num_equations;
    dVar11 = solver->total;
    iVar4 = 0;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      __dest[iVar4] = __dest[iVar4] + 0.0001220703125;
      pdVar7 = (solver->eqns).b;
      pdVar7[uVar5] = pdVar7[uVar5] + (dVar11 / (double)iVar6) * 0.0001220703125;
      iVar4 = iVar4 + uVar1 + 1;
    }
    (solver->eqns).A = __dest;
    iVar6 = equation_system_solve(&solver->eqns);
    (solver->eqns).A = __src;
    aom_free(__dest);
  }
  return iVar6;
}

Assistant:

int aom_noise_strength_solver_solve(aom_noise_strength_solver_t *solver) {
  // Add regularization proportional to the number of constraints
  const int n = solver->num_bins;
  const double kAlpha = 2.0 * (double)(solver->num_equations) / n;
  int result = 0;
  double mean = 0;

  // Do this in a non-destructive manner so it is not confusing to the caller
  double *old_A = solver->eqns.A;
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  if (!A) {
    fprintf(stderr, "Unable to allocate copy of A\n");
    return 0;
  }
  memcpy(A, old_A, sizeof(*A) * n * n);

  for (int i = 0; i < n; ++i) {
    const int i_lo = AOMMAX(0, i - 1);
    const int i_hi = AOMMIN(n - 1, i + 1);
    A[i * n + i_lo] -= kAlpha;
    A[i * n + i] += 2 * kAlpha;
    A[i * n + i_hi] -= kAlpha;
  }

  // Small regularization to give average noise strength
  mean = solver->total / solver->num_equations;
  for (int i = 0; i < n; ++i) {
    A[i * n + i] += 1.0 / 8192.;
    solver->eqns.b[i] += mean / 8192.;
  }
  solver->eqns.A = A;
  result = equation_system_solve(&solver->eqns);
  solver->eqns.A = old_A;

  aom_free(A);
  return result;
}